

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::execMove6<(moira::Instr)71,(moira::Mode)1,(moira::Size)4>(Moira *this,u16 opcode)

{
  undefined1 uVar1;
  uint val;
  u32 uVar2;
  undefined8 in_RAX;
  bool bVar3;
  bool error;
  bool local_21;
  
  local_21 = SUB81((ulong)in_RAX >> 0x38,0);
  val = *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x38);
  bVar3 = SUB41(val >> 0x1f,0);
  (this->reg).sr.n = bVar3;
  uVar1 = false;
  if (val < 0x10000) {
    uVar1 = (this->reg).sr.z;
  }
  (this->reg).sr.z = (bool)uVar1;
  uVar2 = computeEA<(moira::Mode)6,(moira::Size)4,0ul>(this,opcode >> 9 & 7);
  writeM<(moira::MemSpace)1,(moira::Size)4,0ul>(this,uVar2,val,&local_21);
  if (local_21 == false) {
    uVar2 = (this->reg).pc;
    (this->reg).pc0 = uVar2;
    (this->queue).ird = (this->queue).irc;
    uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
    (this->queue).irc = (u16)uVar2;
    (this->reg).sr.n = bVar3;
    (this->reg).sr.z = val == 0;
    (this->reg).sr.v = false;
    (this->reg).sr.c = false;
  }
  return;
}

Assistant:

void
Moira::execMove6(u16 opcode)
{
    u32 ea, data;
    
    int src = _____________xxx(opcode);
    int dst = ____xxx_________(opcode);
    
    if (!readOp <M,S, STD_AE_FRAME> (src, ea, data)) return;
    
    if (S == Long && (M == MODE_DN || M == MODE_AN || M == MODE_IM)) {
        reg.sr.n = NBIT<Word>(data >> 16);
        reg.sr.z = ZERO<Word>(data >> 16) && reg.sr.z;
    } else {
        reg.sr.n = NBIT<S>(data);
        reg.sr.z = ZERO<S>(data);
        reg.sr.v = 0;
        reg.sr.c = 0;
    }
    
    if (!writeOp <MODE_IX,S> (dst, data)) return;
    prefetch<POLLIPL>();

    reg.sr.n = NBIT<S>(data);
    reg.sr.z = ZERO<S>(data);
    reg.sr.v = 0;
    reg.sr.c = 0;
}